

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

double calcAbsMax<float>(TWaveformT<float> *waveform)

{
  size_type sVar1;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<float,_std::allocator<float>_> *pvVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  int i;
  double amax;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0.0;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
    if ((int)sVar1 <= local_14) break;
    pvVar2 = in_RDI;
    std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)local_14);
    std::abs((int)pvVar2);
    if (local_10 < (double)extraout_XMM0_Da) {
      pvVar2 = in_RDI;
      std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)local_14);
      std::abs((int)pvVar2);
      local_10 = (double)extraout_XMM0_Da_00;
    }
    local_14 = local_14 + 1;
  }
  return local_10;
}

Assistant:

double calcAbsMax(const TWaveformT<TSample> & waveform) {
    double amax = 0.0f;
    for (auto i = 0; i < (int) waveform.size(); ++i) if (std::abs(waveform[i]) > amax) amax = std::abs(waveform[i]);

    return amax;
}